

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFile(DescriptorPool *this,FileDescriptorProto *proto)

{
  FileDescriptor *pFVar1;
  long *in_RDI;
  LogMessage *in_stack_fffffffffffffe08;
  LogMessage *in_stack_fffffffffffffe10;
  DescriptorBuilder *this_00;
  undefined8 in_stack_fffffffffffffe18;
  LogLevel level;
  LogMessage *in_stack_fffffffffffffe20;
  Tables *in_stack_fffffffffffffe58;
  Tables *in_stack_fffffffffffffe60;
  DescriptorBuilder *in_stack_fffffffffffffe68;
  DescriptorBuilder *in_stack_fffffffffffffe70;
  LogMessage local_98;
  byte local_49;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  local_49 = 0;
  if (in_RDI[1] != 0) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffe20,level,(char *)in_stack_fffffffffffffe10,
               (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
    local_49 = 1;
    internal::LogMessage::operator<<(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
    internal::LogMessage::operator<<(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x62c3a2);
  }
  if (*in_RDI != 0) {
    internal::LogMessage::LogMessage
              (&local_98,level,(char *)in_stack_fffffffffffffe10,
               (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
    internal::LogMessage::operator<<(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    internal::LogMessage::~LogMessage((LogMessage *)0x62c42c);
  }
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x62c43e);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x62c44a);
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x62c453);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x62c45f);
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::get((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
         *)in_stack_fffffffffffffe10);
  this_00 = (DescriptorBuilder *)&stack0xfffffffffffffe50;
  DescriptorBuilder::DescriptorBuilder
            (in_stack_fffffffffffffe70,(DescriptorPool *)in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe60,(ErrorCollector *)in_stack_fffffffffffffe58);
  pFVar1 = DescriptorBuilder::BuildFile
                     (in_stack_fffffffffffffe68,(FileDescriptorProto *)in_stack_fffffffffffffe60);
  DescriptorBuilder::~DescriptorBuilder(this_00);
  return pFVar1;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFile(
    const FileDescriptorProto& proto) {
  GOOGLE_CHECK(fallback_database_ == nullptr)
      << "Cannot call BuildFile on a DescriptorPool that uses a "
         "DescriptorDatabase.  You must instead find a way to get your file "
         "into the underlying database.";
  GOOGLE_CHECK(mutex_ == nullptr);  // Implied by the above GOOGLE_CHECK.
  tables_->known_bad_symbols_.clear();
  tables_->known_bad_files_.clear();
  return DescriptorBuilder(this, tables_.get(), nullptr).BuildFile(proto);
}